

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WaitOrderStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args,
          Statement **args_1,Statement **args_2,SourceRange *args_3)

{
  Statement *pSVar1;
  Statement *pSVar2;
  pointer ppEVar3;
  size_t sVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  WaitOrderStatement *pWVar7;
  
  pWVar7 = (WaitOrderStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WaitOrderStatement *)this->endPtr < pWVar7 + 1) {
    pWVar7 = (WaitOrderStatement *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pWVar7 + 1);
  }
  ppEVar3 = args->_M_ptr;
  sVar4 = (args->_M_extent)._M_extent_value;
  pSVar1 = *args_1;
  pSVar2 = *args_2;
  SVar5 = args_3->startLoc;
  SVar6 = args_3->endLoc;
  (pWVar7->super_Statement).kind = WaitOrder;
  (pWVar7->super_Statement).syntax = (StatementSyntax *)0x0;
  (pWVar7->super_Statement).sourceRange.startLoc = SVar5;
  (pWVar7->super_Statement).sourceRange.endLoc = SVar6;
  (pWVar7->events)._M_ptr = ppEVar3;
  (pWVar7->events)._M_extent._M_extent_value = sVar4;
  pWVar7->ifTrue = pSVar1;
  pWVar7->ifFalse = pSVar2;
  return pWVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }